

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

nk_uint * nk_find_value(nk_window *win,nk_hash name)

{
  ushort uVar1;
  nk_uint *pnVar2;
  nk_table *pnVar3;
  ulong uVar4;
  
  pnVar3 = win->tables;
  if (pnVar3 != (nk_table *)0x0) {
    uVar1 = win->table_size;
    do {
      if (uVar1 != 0) {
        uVar4 = (ulong)uVar1;
        pnVar2 = pnVar3->values;
        do {
          if (pnVar2[-0x35] == name) {
            pnVar3->seq = win->seq;
            return pnVar2;
          }
          pnVar2 = pnVar2 + 1;
          uVar4 = uVar4 - 1;
        } while (uVar4 != 0);
      }
      pnVar3 = pnVar3->next;
      uVar1 = 0x35;
    } while (pnVar3 != (nk_table *)0x0);
  }
  return (nk_uint *)0x0;
}

Assistant:

NK_INTERN nk_uint*
nk_find_value(struct nk_window *win, nk_hash name)
{
    nk_ushort size = win->table_size;
    struct nk_table *iter = win->tables;
    while (iter) {
        nk_ushort i = 0;
        for (i = 0; i < size; ++i) {
            if (iter->keys[i] == name) {
                iter->seq = win->seq;
                return &iter->values[i];
            }
        }
        size = NK_VALUE_PAGE_CAPACITY;
        iter = iter->next;
    }
    return 0;
}